

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::_::(anonymous_namespace)::TestMessageBuilder>::dispose
          (ArrayBuilder<capnp::_::(anonymous_namespace)::TestMessageBuilder> *this)

{
  TestMessageBuilder *firstElement;
  RemoveConst<capnp::_::(anonymous_namespace)::TestMessageBuilder> *pRVar1;
  TestMessageBuilder *pTVar2;
  TestMessageBuilder *endCopy;
  TestMessageBuilder *posCopy;
  TestMessageBuilder *ptrCopy;
  ArrayBuilder<capnp::_::(anonymous_namespace)::TestMessageBuilder> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pTVar2 = this->endPtr;
  if (firstElement != (TestMessageBuilder *)0x0) {
    this->ptr = (TestMessageBuilder *)0x0;
    this->pos = (RemoveConst<capnp::_::(anonymous_namespace)::TestMessageBuilder> *)0x0;
    this->endPtr = (TestMessageBuilder *)0x0;
    ArrayDisposer::dispose<capnp::_::(anonymous_namespace)::TestMessageBuilder>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0xf8,
               ((long)pTVar2 - (long)firstElement) / 0xf8);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }